

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O1

void __thiscall
vkt::SpirVAssembly::InstanceContext::InstanceContext
          (InstanceContext *this,RGBA (*inputs) [4],RGBA (*outputs) [4],
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *testCodeFragments_,StageToSpecConstantMap *specConstants_)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->moduleMap)._M_t._M_impl.super__Rb_tree_header;
  (this->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->inputColors[0] = 0;
  this->inputColors[1] = 0;
  this->inputColors[2] = 0;
  this->inputColors[3] = 0;
  this->outputColors[0] = 0;
  this->outputColors[1] = 0;
  this->outputColors[2] = 0;
  this->outputColors[3] = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->testCodeFragments)._M_t,&testCodeFragments_->_M_t);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&(this->specConstants)._M_t,&specConstants_->_M_t);
  this->hasTessellation = false;
  this->requiredStages = 0;
  this->failResult = QP_TEST_RESULT_FAIL;
  (this->failMessageTemplate)._M_dataplus._M_p = (pointer)&(this->failMessageTemplate).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->failMessageTemplate,"${reason}","");
  this->inputColors[0].m_value = (*inputs)[0].m_value;
  this->inputColors[1].m_value = (*inputs)[1].m_value;
  this->inputColors[2].m_value = (*inputs)[2].m_value;
  this->inputColors[3].m_value = (*inputs)[3].m_value;
  this->outputColors[0].m_value = (*outputs)[0].m_value;
  this->outputColors[1].m_value = (*outputs)[1].m_value;
  this->outputColors[2].m_value = (*outputs)[2].m_value;
  this->outputColors[3].m_value = (*outputs)[3].m_value;
  return;
}

Assistant:

InstanceContext::InstanceContext (const RGBA					(&inputs)[4],
								  const RGBA					(&outputs)[4],
								  const map<string, string>&	testCodeFragments_,
								  const StageToSpecConstantMap&	specConstants_)
	: testCodeFragments		(testCodeFragments_)
	, specConstants			(specConstants_)
	, hasTessellation		(false)
	, requiredStages		(static_cast<VkShaderStageFlagBits>(0))
	, failResult			(QP_TEST_RESULT_FAIL)
	, failMessageTemplate	("${reason}")
{
	inputColors[0]		= inputs[0];
	inputColors[1]		= inputs[1];
	inputColors[2]		= inputs[2];
	inputColors[3]		= inputs[3];

	outputColors[0]		= outputs[0];
	outputColors[1]		= outputs[1];
	outputColors[2]		= outputs[2];
	outputColors[3]		= outputs[3];
}